

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall smf::Option_register::~Option_register(Option_register *this)

{
  Option_register *this_local;
  
  std::__cxx11::string::~string((string *)&this->modifiedOption);
  std::__cxx11::string::~string((string *)&this->defaultOption);
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Option_register::~Option_register() {
   // do nothing
}